

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

SQClosure * __thiscall SQClosure::Clone(SQClosure *this)

{
  SQUnsignedInteger *pSVar1;
  SQFunctionProto *func;
  SQWeakRef *pSVar2;
  SQClosure *pSVar3;
  long lVar4;
  SQInteger _n_;
  long lVar5;
  
  func = this->_function;
  pSVar3 = Create((this->super_SQCollectable)._sharedstate,func,this->_root);
  pSVar2 = this->_env;
  pSVar3->_env = pSVar2;
  if (pSVar2 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < func->_noutervalues; lVar5 = lVar5 + 1) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar3->_outervalues->super_SQObject)._type + lVar4),
               (SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < func->_ndefaultparams; lVar5 = lVar5 + 1) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar3->_defaultparams->super_SQObject)._type + lVar4),
               (SQObjectPtr *)((long)&(this->_defaultparams->super_SQObject)._type + lVar4));
    lVar4 = lVar4 + 0x10;
  }
  return pSVar3;
}

Assistant:

SQClosure *Clone()
    {
        SQFunctionProto *f = _function;
        SQClosure * ret = SQClosure::Create(_opt_ss(this),f,_root);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        _COPY_VECTOR(ret->_outervalues,_outervalues,f->_noutervalues);
        _COPY_VECTOR(ret->_defaultparams,_defaultparams,f->_ndefaultparams);
        return ret;
    }